

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_NbPut(int g_a,int *lo,int *hi,void *buf,int *ld,ga_nbhdl_t *nbhandle)

{
  long lVar1;
  long lVar2;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long alStack_f8 [2];
  Integer aIStack_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  alStack_f8[1] = 0x10bf4f;
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_70)[lVar2] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_b0)[lVar2] = (long)*hi + 1;
      hi = hi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (1 < lVar1) {
    do {
      alStack_f8[lVar1] = (long)*ld;
      lVar1 = lVar1 + -1;
      ld = ld + 1;
    } while (lVar1 != 1);
  }
  alStack_f8[1] = 0x10bfc3;
  pnga_nbput((long)g_a,local_68,local_a8,buf,aIStack_e8,nbhandle);
  return;
}

Assistant:

void NGA_NbPut(int g_a, int lo[], int hi[], void* buf, int ld[],
               ga_nbhdl_t* nbhandle)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_nbput(a, _ga_lo, _ga_hi, buf, _ga_work,(Integer *)nbhandle);
}